

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O1

int __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectLeaveX(SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *tol)

{
  uint *puVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  pointer pnVar3;
  pointer pnVar4;
  bool bVar5;
  undefined8 uVar6;
  int iVar7;
  ulong *puVar8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_R8;
  long lVar9;
  long lVar10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_1ac;
  cpp_dec_float<50U,_int,_void> local_1a8;
  cpp_dec_float<50U,_int,_void> local_168;
  cpp_dec_float<50U,_int,_void> local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  steeppr local_68 [8];
  uint auStack_60 [2];
  uint local_58 [2];
  undefined8 uStack_50;
  uint local_48 [2];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  pSVar2 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar3 = (pSVar2->coWeights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar4 = (pSVar2->theCoTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ::soplex::infinity::__tls_init();
  puVar8 = (ulong *)__tls_get_addr(&PTR_003b6b60);
  local_128.fpclass = cpp_dec_float_finite;
  local_128.prec_elem = 10;
  local_128.data._M_elems[0] = 0;
  local_128.data._M_elems[1] = 0;
  local_128.data._M_elems[2] = 0;
  local_128.data._M_elems[3] = 0;
  local_128.data._M_elems[4] = 0;
  local_128.data._M_elems[5] = 0;
  local_128.data._M_elems._24_5_ = 0;
  local_128.data._M_elems[7]._1_3_ = 0;
  local_128.data._M_elems._32_5_ = 0;
  local_128.data._M_elems[9]._1_3_ = 0;
  local_128.exp = 0;
  local_128.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_128,(double)(*puVar8 ^ (ulong)DAT_00358350));
  lVar9 = (long)(((this->
                  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thesolver)->thecovectors->set).thenum;
  if (lVar9 < 1) {
    local_1ac = -1;
  }
  else {
    lVar10 = lVar9 * 0x38 + -8;
    local_1ac = -1;
    do {
      local_1a8.data._M_elems._32_8_ =
           *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar10 + -0x10);
      puVar1 = (uint *)((long)&(pnVar4->m_backend).data + lVar10 + -0x30);
      local_1a8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
      local_1a8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&(pnVar4->m_backend).data + lVar10 + -0x20);
      local_1a8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar6 = *(undefined8 *)(puVar1 + 2);
      local_1a8.data._M_elems._24_5_ = SUB85(uVar6,0);
      local_1a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_1a8.exp = *(int *)((long)&(pnVar4->m_backend).data + lVar10 + -8);
      local_1a8.neg = *(bool *)((long)&(pnVar4->m_backend).data + lVar10 + -4);
      local_1a8._48_8_ = *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar10);
      local_168.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8);
      local_168.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
      local_168.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
      local_168.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4);
      local_168.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6);
      local_168.exp = (tol->m_backend).exp;
      local_168.neg = (tol->m_backend).neg;
      local_168.fpclass = (tol->m_backend).fpclass;
      local_168.prec_elem = (tol->m_backend).prec_elem;
      if (local_168.data._M_elems[0] != 0 || local_168.fpclass != cpp_dec_float_finite) {
        local_168.neg = (bool)(local_168.neg ^ 1);
      }
      if ((local_168.fpclass != cpp_dec_float_NaN && local_1a8.fpclass != cpp_dec_float_NaN) &&
         (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_1a8,&local_168), iVar7 < 0)) {
        uStack_50 = CONCAT35(local_1a8.data._M_elems[7]._1_3_,local_1a8.data._M_elems._24_5_);
        local_68 = (steeppr  [8])local_1a8.data._M_elems._0_8_;
        auStack_60[0] = local_1a8.data._M_elems[2];
        auStack_60[1] = local_1a8.data._M_elems[3];
        local_58[0] = local_1a8.data._M_elems[4];
        local_58[1] = local_1a8.data._M_elems[5];
        local_48[0] = local_1a8.data._M_elems[8];
        local_48[1] = local_1a8.data._M_elems[9];
        local_40 = local_1a8.exp;
        local_3c = local_1a8.neg;
        local_38 = local_1a8.fpclass;
        iStack_34 = local_1a8.prec_elem;
        puVar1 = (uint *)((long)&(pnVar3->m_backend).data + lVar10 + -0x30);
        local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
        local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&(pnVar3->m_backend).data + lVar10 + -0x20);
        local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_a8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar10 + -0x10);
        local_a8.m_backend.exp = *(int *)((long)&(pnVar3->m_backend).data + lVar10 + -8);
        local_a8.m_backend.neg = *(bool *)((long)&(pnVar3->m_backend).data + lVar10 + -4);
        local_a8.m_backend._48_8_ = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar10);
        local_e8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 8);
        local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
        local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2)
        ;
        local_e8.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 4);
        local_e8.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 6);
        local_e8.m_backend.exp = (tol->m_backend).exp;
        local_e8.m_backend.neg = (tol->m_backend).neg;
        local_e8.m_backend.fpclass = (tol->m_backend).fpclass;
        local_e8.m_backend.prec_elem = (tol->m_backend).prec_elem;
        steeppr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_168,local_68,&local_a8,&local_e8,in_R8);
        local_1a8.data._M_elems[8] = local_168.data._M_elems[8];
        local_1a8.data._M_elems[9] = local_168.data._M_elems[9];
        local_1a8.data._M_elems[4] = local_168.data._M_elems[4];
        local_1a8.data._M_elems[5] = local_168.data._M_elems[5];
        local_1a8.data._M_elems._24_5_ = local_168.data._M_elems._24_5_;
        local_1a8.data._M_elems[7]._1_3_ = local_168.data._M_elems[7]._1_3_;
        local_1a8.data._M_elems[0] = local_168.data._M_elems[0];
        local_1a8.data._M_elems[1] = local_168.data._M_elems[1];
        local_1a8.data._M_elems[2] = local_168.data._M_elems[2];
        local_1a8.data._M_elems[3] = local_168.data._M_elems[3];
        local_1a8.exp = local_168.exp;
        local_1a8.neg = local_168.neg;
        local_1a8.fpclass = local_168.fpclass;
        local_1a8.prec_elem = local_168.prec_elem;
        if ((local_168.fpclass != cpp_dec_float_NaN) &&
           ((local_128.fpclass != cpp_dec_float_NaN &&
            (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_1a8,&local_128), 0 < iVar7)))) {
          local_128.data._M_elems._32_5_ = local_1a8.data._M_elems._32_5_;
          local_128.data._M_elems[9]._1_3_ = local_1a8.data._M_elems[9]._1_3_;
          local_128.data._M_elems[0] = local_1a8.data._M_elems[0];
          local_128.data._M_elems[1] = local_1a8.data._M_elems[1];
          local_128.data._M_elems[2] = local_1a8.data._M_elems[2];
          local_128.data._M_elems[3] = local_1a8.data._M_elems[3];
          local_128.data._M_elems[4] = local_1a8.data._M_elems[4];
          local_128.data._M_elems[5] = local_1a8.data._M_elems[5];
          local_128.data._M_elems._24_5_ = local_1a8.data._M_elems._24_5_;
          local_128.data._M_elems[7]._1_3_ = local_1a8.data._M_elems[7]._1_3_;
          local_128.exp = local_1a8.exp;
          local_128.neg = local_1a8.neg;
          local_128.fpclass = local_1a8.fpclass;
          local_128.prec_elem = local_1a8.prec_elem;
          local_1ac = (int)lVar9 + -1;
        }
      }
      lVar10 = lVar10 + -0x38;
      bVar5 = 1 < lVar9;
      lVar9 = lVar9 + -1;
    } while (bVar5);
  }
  return local_1ac;
}

Assistant:

int SPxSteepPR<R>::selectLeaveX(R tol)
{
   const R* coWeights_ptr = this->thesolver->coWeights.get_const_ptr();
   const R* fTest         = this->thesolver->fTest().get_const_ptr();
   R best = R(-infinity);
   R x;
   int lastIdx = -1;

   for(int i = this->thesolver->dim() - 1; i >= 0; --i)
   {
      x = fTest[i];

      if(x < -tol)
      {
         x = steeppr::computePrice(x, coWeights_ptr[i], tol);

         if(x > best)
         {
            best = x;
            lastIdx = i;
         }
      }
   }

   return lastIdx;
}